

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O0

void __thiscall csv::internals::IBasicCSVParser::push_field(IBasicCSVParser *this)

{
  uint local_44;
  uint local_34;
  uint local_1c;
  bool local_15;
  uint local_14;
  IBasicCSVParser *local_10;
  IBasicCSVParser *this_local;
  
  local_10 = this;
  if ((this->field_has_double_quote & 1U) == 0) {
    if (this->field_start == -1) {
      local_44 = 0;
    }
    else {
      local_44 = this->field_start;
    }
    local_1c = local_44;
    CSVFieldList::emplace_back<unsigned_int,unsigned_long&>
              (this->fields,&local_1c,&this->field_length);
  }
  else {
    if (this->field_start == -1) {
      local_34 = 0;
    }
    else {
      local_34 = this->field_start;
    }
    local_14 = local_34;
    local_15 = true;
    CSVFieldList::emplace_back<unsigned_int,unsigned_long&,bool>
              (this->fields,&local_14,&this->field_length,&local_15);
    this->field_has_double_quote = false;
  }
  (this->current_row).row_length = (this->current_row).row_length + 1;
  this->field_start = -1;
  this->field_length = 0;
  return;
}

Assistant:

CSV_INLINE void IBasicCSVParser::push_field()
        {
            // Update
            if (field_has_double_quote) {
                fields->emplace_back(
                    field_start == UNINITIALIZED_FIELD ? 0 : (unsigned int)field_start,
                    field_length,
                    true
                );
                field_has_double_quote = false;

            }
            else {
                fields->emplace_back(
                    field_start == UNINITIALIZED_FIELD ? 0 : (unsigned int)field_start,
                    field_length
                );
            }

            current_row.row_length++;

            // Reset field state
            field_start = UNINITIALIZED_FIELD;
            field_length = 0;
        }